

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O3

void chaiscript::bootstrap::standard_library::detail::
     insert_at<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *container
               ,int pos,value_type *v)

{
  pointer pBVar1;
  range_error *this;
  
  if (-1 < pos) {
    pBVar1 = (container->
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)(ulong)(uint)pos <=
        (long)(container->
              super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)
              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4) {
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::insert
                (container,pBVar1 + (uint)pos,v);
      return;
    }
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,"Cannot insert past end of range");
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void insert_at(Type &container, int pos, const typename Type::value_type &v) {
      auto itr = container.begin();
      auto end = container.end();

      if (pos < 0 || std::distance(itr, end) < pos) {
        throw std::range_error("Cannot insert past end of range");
      }

      std::advance(itr, pos);
      container.insert(itr, v);
    }